

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O1

short __thiscall xercesc_4_0::DOMNodeImpl::compareDocumentPosition(DOMNodeImpl *this,DOMNode *other)

{
  short sVar1;
  int iVar2;
  DOMNode *pDVar3;
  DOMNode *pDVar4;
  DOMNode *pDVar5;
  undefined4 extraout_var;
  uint uVar6;
  DOMNodeImpl *this_00;
  DOMNode *node;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  
  pDVar4 = this->fContainingNode;
  if ((pDVar4 == other) || (iVar2 = (*pDVar4->_vptr_DOMNode[4])(pDVar4), 0xc < iVar2)) {
    sVar1 = 0;
  }
  else {
    this_00 = (DOMNodeImpl *)other;
    iVar2 = (*other->_vptr_DOMNode[4])();
    if (0xc < iVar2) {
      iVar2 = (*other->_vptr_DOMNode[0x20])(other,pDVar4);
      sVar1 = reverseTreeOrderBitPattern((DOMNodeImpl *)other,(short)iVar2);
      return sVar1;
    }
    pDVar5 = this->fContainingNode;
    pDVar3 = getTreeParentNode(this_00,pDVar5);
    uVar6 = 0;
    uVar7 = 0;
    if (pDVar3 != (DOMNode *)0x0) {
      uVar7 = 0;
      do {
        pDVar5 = pDVar3;
        if (pDVar5 == other) {
          return 10;
        }
        uVar7 = uVar7 + 1;
        pDVar3 = getTreeParentNode(this_00,pDVar5);
      } while (pDVar3 != (DOMNode *)0x0);
    }
    pDVar3 = getTreeParentNode(this_00,other);
    node = other;
    if (pDVar3 != (DOMNode *)0x0) {
      uVar6 = 0;
      do {
        node = pDVar3;
        if (node == pDVar4) {
          return 0x14;
        }
        uVar6 = uVar6 + 1;
        pDVar3 = getTreeParentNode(this_00,node);
      } while (pDVar3 != (DOMNode *)0x0);
    }
    if (pDVar5 == node) {
      pDVar4 = this->fContainingNode;
      iVar2 = uVar7 - uVar6;
      if (uVar7 < uVar6 || iVar2 == 0) {
        iVar2 = uVar6 - uVar7;
        if (iVar2 != 0 && (int)uVar7 <= (int)uVar6) {
          do {
            other = getTreeParentNode(this_00,other);
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
      }
      else if (iVar2 != 0 && (int)uVar6 <= (int)uVar7) {
        do {
          pDVar4 = getTreeParentNode(this_00,pDVar4);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      pDVar5 = other;
      pDVar3 = pDVar4;
      if (pDVar4 != other) {
        do {
          pDVar4 = pDVar3;
          other = pDVar5;
          pDVar3 = getTreeParentNode(this_00,pDVar4);
          pDVar5 = getTreeParentNode(this_00,other);
        } while (pDVar3 != pDVar5);
      }
      uVar6 = (*pDVar4->_vptr_DOMNode[4])(pDVar4);
      uVar7 = (*other->_vptr_DOMNode[4])(other);
      bVar8 = (uVar6 & 0xfffb) == 2;
      bVar9 = (uVar6 & 0xffff) == 0xc;
      bVar10 = (uVar7 & 0xfffb) != 2;
      bVar11 = (uVar7 & 0xffff) != 0xc;
      if ((bVar9 || bVar8) || (!bVar11 || !bVar10)) {
        sVar1 = 4;
        if ((!bVar9 && !bVar8 || (!bVar11 || !bVar10)) &&
           (sVar1 = 2, (bVar9 || bVar8) || bVar11 && bVar10)) {
          if ((short)uVar6 == (short)uVar7) {
            sVar1 = (ushort)(pDVar4 < other) * 2 + 0x22;
          }
          else {
            sVar1 = (ushort)((short)uVar6 < (short)uVar7) * 2 + 2;
          }
        }
      }
      else {
        do {
          if (pDVar4 == (DOMNode *)0x0) {
            return 2;
          }
          iVar2 = (*pDVar4->_vptr_DOMNode[10])(pDVar4);
          pDVar4 = (DOMNode *)CONCAT44(extraout_var,iVar2);
          sVar1 = 4;
        } while (pDVar4 != other);
      }
    }
    else {
      sVar1 = (ushort)(node <= pDVar5) * 2 + 0x23;
    }
  }
  return sVar1;
}

Assistant:

const DOMNode* DOMNodeImpl::getContainingNode() const {
    return fContainingNode;
}